

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O0

void rsg::computeRandomValue(Random *rnd,ValueAccess dst,ConstValueRangeAccess valueRange)

{
  ConstValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  VariableType *pVVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  bool *pbVar7;
  int *piVar8;
  vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_> *this;
  size_type sVar9;
  TestError *this_00;
  float fVar10;
  ConstValueRangeAccess local_1e0;
  ConstStridedValueAccess<1> local_1c8;
  int local_1b8;
  int local_1b4;
  int ndx_4;
  int numMembers;
  Scalar *local_1a8;
  Scalar *local_1a0;
  ConstStridedValueAccess<1> local_198;
  int local_188;
  int local_184;
  int ndx_3;
  int numElements;
  ConstValueRangeAccess local_170;
  ConstValueAccess local_158;
  int local_144;
  undefined1 local_140 [4];
  int maxVal_2;
  ConstValueAccess local_128;
  int local_118;
  int local_114;
  int minVal_2;
  int ndx_2;
  ConstValueRangeAccess local_100;
  ConstValueAccess local_e8;
  uint local_d4;
  undefined1 local_d0 [4];
  int maxVal_1;
  ConstValueAccess local_b8;
  uint local_a8;
  int local_a4;
  int minVal_1;
  int ndx_1;
  ConstValueRangeAccess local_90;
  ConstValueAccess local_78;
  float local_64;
  undefined1 local_60 [4];
  float maxVal;
  ConstValueAccess local_48;
  float local_34;
  undefined4 local_30;
  float minVal;
  float quantizeStep;
  int ndx;
  VariableType *type;
  Random *rnd_local;
  ValueAccess dst_local;
  
  dst_local.super_ConstStridedValueAccess<1>.m_type =
       (VariableType *)dst.super_ConstStridedValueAccess<1>.m_value;
  rnd_local = (Random *)dst.super_ConstStridedValueAccess<1>.m_type;
  type = (VariableType *)rnd;
  _quantizeStep = ConstStridedValueAccess<1>::getType((ConstStridedValueAccess<1> *)&rnd_local);
  TVar3 = VariableType::getBaseType(_quantizeStep);
  switch(TVar3) {
  case TYPE_FLOAT:
    for (minVal = 0.0; fVar10 = minVal, iVar5 = VariableType::getNumElements(_quantizeStep),
        (int)fVar10 < iVar5; minVal = (float)((int)minVal + 1)) {
      local_30 = 0x3e000000;
      ConstValueRangeAccess::component((ConstValueRangeAccess *)local_60,&valueRange,(int)minVal);
      local_48 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_60);
      local_34 = ConstStridedValueAccess<1>::asFloat(&local_48);
      ConstValueRangeAccess::component(&local_90,&valueRange,(int)minVal);
      local_78 = ConstValueRangeAccess::getMax(&local_90);
      local_64 = ConstStridedValueAccess<1>::asFloat(&local_78);
      fVar10 = getQuantizedFloat((Random *)type,local_34,local_64,0.125);
      _minVal_1 = (ConstStridedValueAccess<1>)
                  StridedValueAccess<1>::component((StridedValueAccess<1> *)&rnd_local,(int)minVal);
      pfVar6 = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&minVal_1);
      *pfVar6 = fVar10;
    }
    break;
  case TYPE_INT:
  case TYPE_SAMPLER_2D:
  case TYPE_SAMPLER_CUBE:
    for (local_114 = 0; iVar5 = local_114, iVar4 = VariableType::getNumElements(_quantizeStep),
        iVar5 < iVar4; local_114 = local_114 + 1) {
      ConstValueRangeAccess::component((ConstValueRangeAccess *)local_140,&valueRange,local_114);
      local_128 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_140);
      local_118 = ConstStridedValueAccess<1>::asInt(&local_128);
      ConstValueRangeAccess::component(&local_170,&valueRange,local_114);
      local_158 = ConstValueRangeAccess::getMax(&local_170);
      local_144 = ConstStridedValueAccess<1>::asInt(&local_158);
      iVar5 = de::Random::getInt((Random *)type,local_118,local_144);
      _ndx_3 = (ConstStridedValueAccess<1>)
               StridedValueAccess<1>::component((StridedValueAccess<1> *)&rnd_local,local_114);
      piVar8 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&ndx_3);
      *piVar8 = iVar5;
    }
    break;
  case TYPE_BOOL:
    for (local_a4 = 0; iVar5 = local_a4, iVar4 = VariableType::getNumElements(_quantizeStep),
        iVar5 < iVar4; local_a4 = local_a4 + 1) {
      ConstValueRangeAccess::component((ConstValueRangeAccess *)local_d0,&valueRange,local_a4);
      local_b8 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_d0);
      bVar2 = ConstStridedValueAccess<1>::asBool(&local_b8);
      local_a8 = (uint)bVar2;
      ConstValueRangeAccess::component(&local_100,&valueRange,local_a4);
      local_e8 = ConstValueRangeAccess::getMin(&local_100);
      bVar2 = ConstStridedValueAccess<1>::asBool(&local_e8);
      local_d4 = (uint)bVar2;
      iVar5 = de::Random::getInt((Random *)type,local_a8,local_d4);
      _minVal_2 = (ConstStridedValueAccess<1>)
                  StridedValueAccess<1>::component((StridedValueAccess<1> *)&rnd_local,local_a4);
      pbVar7 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)&minVal_2);
      *pbVar7 = iVar5 == 1;
    }
    break;
  case TYPE_STRUCT:
    this = VariableType::getMembers(_quantizeStep);
    sVar9 = std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::size
                      (this);
    local_1b4 = (int)sVar9;
    for (local_1b8 = 0; pVVar1 = type, local_1b8 < local_1b4; local_1b8 = local_1b8 + 1) {
      local_1c8 = (ConstStridedValueAccess<1>)
                  StridedValueAccess<1>::member((StridedValueAccess<1> *)&rnd_local,local_1b8);
      ConstValueRangeAccess::member(&local_1e0,&valueRange,local_1b8);
      valueRange_01.m_min = local_1e0.m_min;
      valueRange_01.m_type = local_1e0.m_type;
      valueRange_01.m_max = local_1e0.m_max;
      computeRandomValue((Random *)pVVar1,(ValueAccess)local_1c8,valueRange_01);
    }
    break;
  case TYPE_ARRAY:
    local_184 = VariableType::getNumElements(_quantizeStep);
    for (local_188 = 0; pVVar1 = type, local_188 < local_184; local_188 = local_188 + 1) {
      local_198 = (ConstStridedValueAccess<1>)
                  StridedValueAccess<1>::arrayElement((StridedValueAccess<1> *)&rnd_local,local_188)
      ;
      ConstValueRangeAccess::arrayElement((ConstValueRangeAccess *)&ndx_4,&valueRange,local_188);
      valueRange_00.m_min = local_1a8;
      valueRange_00.m_type = _ndx_4;
      valueRange_00.m_max = local_1a0;
      computeRandomValue((Random *)pVVar1,(ValueAccess)local_198,valueRange_00);
    }
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgUtils.cpp"
               ,0x6e);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void computeRandomValue (de::Random& rnd, ValueAccess dst, ConstValueRangeAccess valueRange)
{
	const VariableType& type = dst.getType();

	switch (type.getBaseType())
	{
		case VariableType::TYPE_FLOAT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				const float quantizeStep = 1.0f/8.0f;
				float minVal = valueRange.component(ndx).getMin().asFloat();
				float maxVal = valueRange.component(ndx).getMax().asFloat();
				dst.component(ndx).asFloat() = getQuantizedFloat(rnd, minVal, maxVal, quantizeStep);
			}
			break;

		case VariableType::TYPE_BOOL:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				int minVal = valueRange.component(ndx).getMin().asBool() ? 1 : 0;
				int maxVal = valueRange.component(ndx).getMin().asBool() ? 1 : 0;
				dst.component(ndx).asBool() = rnd.getInt(minVal, maxVal) == 1;
			}
			break;

		case VariableType::TYPE_INT:
		case VariableType::TYPE_SAMPLER_2D:
		case VariableType::TYPE_SAMPLER_CUBE:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				int	minVal = valueRange.component(ndx).getMin().asInt();
				int maxVal = valueRange.component(ndx).getMax().asInt();
				dst.component(ndx).asInt() = rnd.getInt(minVal, maxVal);
			}
			break;

		case VariableType::TYPE_ARRAY:
		{
			int numElements = type.getNumElements();
			for (int ndx = 0; ndx < numElements; ndx++)
				computeRandomValue(rnd, dst.arrayElement(ndx), valueRange.arrayElement(ndx));
			break;
		}

		case VariableType::TYPE_STRUCT:
		{
			int numMembers = (int)type.getMembers().size();
			for (int ndx = 0; ndx < numMembers; ndx++)
				computeRandomValue(rnd, dst.member(ndx), valueRange.member(ndx));
			break;
		}

		default:
			TCU_FAIL("Invalid type");
	}
}